

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall
twitter::zipkin::thrift::BinaryAnnotation::BinaryAnnotation
          (BinaryAnnotation *this,BinaryAnnotation *other5)

{
  BinaryAnnotation *other5_local;
  BinaryAnnotation *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__BinaryAnnotation_004fd680;
  *(undefined ***)this = &PTR__BinaryAnnotation_004fd680;
  std::__cxx11::string::string((string *)&this->key);
  std::__cxx11::string::string((string *)&this->value);
  Endpoint::Endpoint(&this->host);
  _BinaryAnnotation__isset::_BinaryAnnotation__isset(&this->__isset);
  std::__cxx11::string::operator=((string *)&this->key,(string *)&other5->key);
  std::__cxx11::string::operator=((string *)&this->value,(string *)&other5->value);
  this->annotation_type = other5->annotation_type;
  Endpoint::operator=(&this->host,&other5->host);
  this->__isset = other5->__isset;
  return;
}

Assistant:

BinaryAnnotation::BinaryAnnotation(const BinaryAnnotation& other5) {
  key = other5.key;
  value = other5.value;
  annotation_type = other5.annotation_type;
  host = other5.host;
  __isset = other5.__isset;
}